

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemory(BinaryReader *this,Limits *out_page_limits)

{
  pointer *ppLVar1;
  iterator __position;
  uint64_t uVar2;
  bool bVar3;
  bool bVar4;
  undefined5 uVar5;
  Result RVar6;
  Enum EVar7;
  char *format;
  uint8_t flags;
  uint64_t max;
  uint32_t max32;
  uint32_t initial32;
  uint64_t initial;
  byte local_49;
  uint64_t local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  local_48 = 0;
  RVar6 = ReadU8(this,&local_49,"memory flags");
  EVar7 = Error;
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  if (7 < local_49) {
    PrintError(this,"malformed memory limits flag: %d",(ulong)(uint)local_49);
    return (Result)Error;
  }
  if (((local_49 & 2) == 0) || ((this->options_->features).threads_enabled_ != false)) {
    if ((local_49 & 4) == 0) {
      RVar6 = ReadU32Leb128(this,&local_3c,"memory initial page count");
      if (RVar6.enum_ == Error) {
        return (Result)Error;
      }
      local_38 = (ulong)local_3c;
      if ((local_49 & 1) != 0) {
        RVar6 = ReadU32Leb128(this,&local_40,"memory max page count");
        if (RVar6.enum_ == Error) {
          return (Result)Error;
        }
        local_48 = (uint64_t)local_40;
      }
    }
    else {
      if ((this->options_->features).memory64_enabled_ == false) {
        format = "memory64 not allowed";
        goto LAB_001285bc;
      }
      RVar6 = ReadU64Leb128(this,&local_38,"memory initial page count");
      if (RVar6.enum_ == Error) {
        return (Result)Error;
      }
      if (((local_49 & 1) != 0) &&
         (RVar6 = ReadU64Leb128(this,&local_48,"memory max page count"), RVar6.enum_ == Error)) {
        return (Result)Error;
      }
    }
    out_page_limits->has_max = (bool)(local_49 & 1);
    out_page_limits->is_shared = SUB41((local_49 & 2) >> 1,0);
    out_page_limits->is_64 = SUB41((local_49 & 4) >> 2,0);
    out_page_limits->initial = local_38;
    out_page_limits->max = local_48;
    __position._M_current =
         (this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Limits,std::allocator<wabt::Limits>>::_M_realloc_insert<wabt::Limits_const&>
                ((vector<wabt::Limits,std::allocator<wabt::Limits>> *)&this->memories,__position,
                 out_page_limits);
    }
    else {
      bVar3 = out_page_limits->is_shared;
      bVar4 = out_page_limits->is_64;
      uVar5 = *(undefined5 *)&out_page_limits->field_0x13;
      (__position._M_current)->has_max = out_page_limits->has_max;
      (__position._M_current)->is_shared = bVar3;
      (__position._M_current)->is_64 = bVar4;
      *(undefined5 *)&(__position._M_current)->field_0x13 = uVar5;
      uVar2 = out_page_limits->max;
      (__position._M_current)->initial = out_page_limits->initial;
      (__position._M_current)->max = uVar2;
      ppLVar1 = &(this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + 1;
    }
    EVar7 = Ok;
  }
  else {
    format = "memory may not be shared: threads not allowed";
LAB_001285bc:
    PrintError(this,format);
  }
  return (Result)EVar7;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits) {
  uint8_t flags;
  uint64_t initial;
  uint64_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "memory flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_FLAGS;
  ERROR_UNLESS(unknown_flags == 0, "malformed memory limits flag: %d", flags);
  ERROR_IF(is_shared && !options_.features.threads_enabled(),
           "memory may not be shared: threads not allowed");
  ERROR_IF(is_64 && !options_.features.memory64_enabled(),
           "memory64 not allowed");
  if (is_64) {
    CHECK_RESULT(ReadU64Leb128(&initial, "memory initial page count"));
    if (has_max) {
      CHECK_RESULT(ReadU64Leb128(&max, "memory max page count"));
    }
  } else {
    uint32_t initial32;
    CHECK_RESULT(ReadU32Leb128(&initial32, "memory initial page count"));
    initial = initial32;
    if (has_max) {
      uint32_t max32;
      CHECK_RESULT(ReadU32Leb128(&max32, "memory max page count"));
      max = max32;
    }
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->is_64 = is_64;
  out_page_limits->initial = initial;
  out_page_limits->max = max;

  // Have to keep a copy of these, to know how to interpret load/stores.
  memories.push_back(*out_page_limits);
  return Result::Ok;
}